

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadIndexData(ColladaParser *this,Mesh *pMesh)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type __n;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  undefined4 extraout_var_01;
  basic_formatter *pbVar6;
  undefined4 extraout_var_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_2c8;
  char *local_2a8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_128;
  ulong local_108;
  allocator<char> local_f9;
  string local_f8;
  uint local_d4;
  char *pcStack_d0;
  uint a;
  char *content;
  PrimitiveType primType;
  string elementName;
  SubMesh subgroup;
  size_type sStack_70;
  int attrMaterial;
  size_t actualPrimitives;
  size_t numPrimitives;
  undefined1 local_48 [4];
  int attrCount;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> perIndexData
  ;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vcount;
  Mesh *pMesh_local;
  ColladaParser *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &perIndexData.
              super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::vector
            ((vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              *)local_48);
  uVar2 = GetAttribute(this,"count");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar2);
  __n = (size_type)iVar3;
  sStack_70 = 0;
  uVar2 = TestAttribute(this,"material");
  Collada::SubMesh::SubMesh((SubMesh *)((long)&elementName.field_2 + 8));
  if (-1 < (int)uVar2) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
    std::__cxx11::string::operator=
              ((string *)(elementName.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var,iVar3)
              );
  }
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&primType,(char *)CONCAT44(extraout_var_00,iVar3),
             (allocator<char> *)((long)&content + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&content + 7));
  content._0_4_ = Prim_Invalid;
  bVar1 = IsElement(this,"lines");
  if (bVar1) {
    content._0_4_ = Prim_Lines;
  }
  else {
    bVar1 = IsElement(this,"linestrips");
    if (bVar1) {
      content._0_4_ = Prim_LineStrip;
    }
    else {
      bVar1 = IsElement(this,"polygons");
      if (bVar1) {
        content._0_4_ = Prim_Polygon;
      }
      else {
        bVar1 = IsElement(this,"polylist");
        if (bVar1) {
          content._0_4_ = Prim_Polylist;
        }
        else {
          bVar1 = IsElement(this,"triangles");
          if (bVar1) {
            content._0_4_ = Prim_Triangles;
          }
          else {
            bVar1 = IsElement(this,"trifans");
            if (bVar1) {
              content._0_4_ = Prim_TriFans;
            }
            else {
              bVar1 = IsElement(this,"tristrips");
              if (bVar1) {
                content._0_4_ = Prim_TriStrips;
              }
            }
          }
        }
      }
    }
  }
  if ((PrimitiveType)content == Prim_Invalid) {
    __assert_fail("primType != Prim_Invalid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                  ,0x97b,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
  }
  do {
    while( true ) {
      uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((uVar2 & 1) == 0) goto LAB_00679ed8;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 != 1) break;
      bVar1 = IsElement(this,"input");
      if (bVar1) {
        ReadInputChannel(this,(vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                               *)local_48);
      }
      else {
        bVar1 = IsElement(this,"vcount");
        if (bVar1) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((uVar2 & 1) == 0) {
            if (__n != 0) {
              pcStack_d0 = GetTextContent(this);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &perIndexData.
                          super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
              for (local_d4 = 0; local_d4 < __n; local_d4 = local_d4 + 1) {
                if (*pcStack_d0 == '\0') {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_f8,
                             "Expected more values while reading <vcount> contents.",&local_f9);
                  ThrowException(this,&local_f8);
                }
                uVar2 = strtoul10(pcStack_d0,&stack0xffffffffffffff30);
                local_108 = (ulong)uVar2;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &perIndexData.
                            super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_108);
                SkipSpacesAndLineEnd<char>(&stack0xffffffffffffff30);
              }
            }
            TestClosing(this,"vcount");
          }
        }
        else {
          bVar1 = IsElement(this,"p");
          if (bVar1) {
            uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((uVar2 & 1) == 0) {
              sVar4 = ReadPrimitives(this,pMesh,
                                     (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                                      *)local_48,__n,
                                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &perIndexData.
                                      super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (PrimitiveType)content);
              sStack_70 = sVar4 + sStack_70;
            }
          }
          else {
            bVar1 = IsElement(this,"extra");
            if (bVar1) {
              SkipElement(this,"extra");
            }
            else {
              bVar1 = IsElement(this,"ph");
              if (!bVar1) {
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter(&local_2a0);
                pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&local_2a0,(char (*) [25])"Unexpected sub element <");
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                local_2a8 = (char *)CONCAT44(extraout_var_01,iVar3);
                pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar5,&local_2a8);
                pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar5,(char (*) [11])"> in tag <");
                pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&primType);
                pbVar6 = (basic_formatter *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar5,(char (*) [2])0xba025a);
                Formatter::basic_formatter::operator_cast_to_string(&local_128,pbVar6);
                ThrowException(this,&local_128);
              }
              SkipElement(this,"ph");
            }
          }
        }
      }
    }
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  } while (iVar3 != 2);
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  bVar1 = std::operator!=((char *)CONCAT44(extraout_var_02,iVar3),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &primType);
  if (bVar1) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_440);
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_440,(char (*) [18])"Expected end of <");
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &primType);
    pbVar6 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar5,(char (*) [11])0xbb7096);
    Formatter::basic_formatter::operator_cast_to_string(&local_2c8,pbVar6);
    ThrowException(this,&local_2c8);
  }
LAB_00679ed8:
  if (((((PrimitiveType)content != Prim_TriFans) && ((PrimitiveType)content != Prim_TriStrips)) &&
      ((PrimitiveType)content != Prim_LineStrip)) &&
     (((PrimitiveType)content != Prim_Lines && (sStack_70 != __n)))) {
    __assert_fail("actualPrimitives == numPrimitives",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                  ,0x9bc,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
  }
  std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>::push_back
            (&pMesh->mSubMeshes,(value_type *)((long)&elementName.field_2 + 8));
  std::__cxx11::string::~string((string *)&primType);
  Collada::SubMesh::~SubMesh((SubMesh *)((long)&elementName.field_2 + 8));
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
  ~vector((vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *)
          local_48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &perIndexData.
              super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ColladaParser::ReadIndexData(Mesh* pMesh)
{
    std::vector<size_t> vcount;
    std::vector<InputChannel> perIndexData;

    // read primitive count from the attribute
    int attrCount = GetAttribute("count");
    size_t numPrimitives = (size_t)mReader->getAttributeValueAsInt(attrCount);
    // some mesh types (e.g. tristrips) don't specify primitive count upfront,
    // so we need to sum up the actual number of primitives while we read the <p>-tags
    size_t actualPrimitives = 0;

    // material subgroup
    int attrMaterial = TestAttribute("material");
    SubMesh subgroup;
    if (attrMaterial > -1)
        subgroup.mMaterial = mReader->getAttributeValue(attrMaterial);

    // distinguish between polys and triangles
    std::string elementName = mReader->getNodeName();
    PrimitiveType primType = Prim_Invalid;
    if (IsElement("lines"))
        primType = Prim_Lines;
    else if (IsElement("linestrips"))
        primType = Prim_LineStrip;
    else if (IsElement("polygons"))
        primType = Prim_Polygon;
    else if (IsElement("polylist"))
        primType = Prim_Polylist;
    else if (IsElement("triangles"))
        primType = Prim_Triangles;
    else if (IsElement("trifans"))
        primType = Prim_TriFans;
    else if (IsElement("tristrips"))
        primType = Prim_TriStrips;

    ai_assert(primType != Prim_Invalid);

    // also a number of <input> elements, but in addition a <p> primitive collection and probably index counts for all primitives
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                ReadInputChannel(perIndexData);
            }
            else if (IsElement("vcount"))
            {
                if (!mReader->isEmptyElement())
                {
                    if (numPrimitives)  // It is possible to define a mesh without any primitives
                    {
                        // case <polylist> - specifies the number of indices for each polygon
                        const char* content = GetTextContent();
                        vcount.reserve(numPrimitives);
                        for (unsigned int a = 0; a < numPrimitives; a++)
                        {
                            if (*content == 0)
                                ThrowException("Expected more values while reading <vcount> contents.");
                            // read a number
                            vcount.push_back((size_t)strtoul10(content, &content));
                            // skip whitespace after it
                            SkipSpacesAndLineEnd(&content);
                        }
                    }

                    TestClosing("vcount");
                }
            }
            else if (IsElement("p"))
            {
                if (!mReader->isEmptyElement())
                {
                    // now here the actual fun starts - these are the indices to construct the mesh data from
                    actualPrimitives += ReadPrimitives(pMesh, perIndexData, numPrimitives, vcount, primType);
                }
            }
            else if (IsElement("extra"))
            {
                SkipElement("extra");
            }
            else if (IsElement("ph")) {
                SkipElement("ph");
            }
            else {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <" << elementName << ">");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (mReader->getNodeName() != elementName)
                ThrowException(format() << "Expected end of <" << elementName << "> element.");

            break;
        }
    }

#ifdef ASSIMP_BUILD_DEBUG
    if (primType != Prim_TriFans && primType != Prim_TriStrips && primType != Prim_LineStrip &&
        primType != Prim_Lines) { // this is ONLY to workaround a bug in SketchUp 15.3.331 where it writes the wrong 'count' when it writes out the 'lines'.
        ai_assert(actualPrimitives == numPrimitives);
    }
#endif

    // only when we're done reading all <p> tags (and thus know the final vertex count) can we commit the submesh
    subgroup.mNumFaces = actualPrimitives;
    pMesh->mSubMeshes.push_back(subgroup);
}